

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O0

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray
          (Cdr *this,wchar_t *wchar,size_t numElements,Endianness endianness)

{
  bool bVar1;
  uint8_t in_CL;
  byte bVar2;
  Cdr *in_RDI;
  Exception *ex;
  bool auxSwap;
  bool local_42;
  bool local_41;
  size_t in_stack_ffffffffffffffd0;
  wchar_t *in_stack_ffffffffffffffd8;
  undefined6 in_stack_ffffffffffffffe0;
  
  bVar1 = in_RDI->m_swapBytes;
  bVar2 = bVar1 & 1;
  if (((in_RDI->m_swapBytes & 1U) == 0) || (local_41 = true, in_RDI->m_endianness != in_CL)) {
    local_42 = false;
    if ((in_RDI->m_swapBytes & 1U) == 0) {
      local_42 = in_RDI->m_endianness != in_CL;
    }
    local_41 = local_42;
  }
  in_RDI->m_swapBytes = local_41;
  deserializeArray((Cdr *)(CONCAT17(in_CL,CONCAT16(bVar1,in_stack_ffffffffffffffe0)) &
                          0xff01ffffffffffff),in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  in_RDI->m_swapBytes = (bool)(bVar2 & 1);
  return in_RDI;
}

Assistant:

Cdr& Cdr::deserializeArray(wchar_t *wchar, size_t numElements, Endianness endianness)
{
    bool auxSwap = m_swapBytes;
    m_swapBytes = (m_swapBytes && (m_endianness == endianness)) || (!m_swapBytes && (m_endianness != endianness));

    try
    {
        deserializeArray(wchar, numElements);
        m_swapBytes = auxSwap;
    }
    catch(Exception &ex)
    {
        m_swapBytes = auxSwap;
        ex.raise();
    }

    return *this;
}